

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

undefined8 fmt::v8::system_error<>(int error_code,format_string<> fmt)

{
  format_args args;
  string_view format_str;
  undefined8 in_RDI;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_a8 [3];
  undefined8 local_90;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_88;
  undefined1 local_68 [24];
  undefined1 *local_50;
  int in_stack_ffffffffffffffcc;
  
  local_50 = local_68;
  local_a8[0] = make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>>();
  local_88 = local_a8;
  local_90 = 0;
  format_str.size_ = (size_t)local_88;
  format_str.data_ = (char *)local_88;
  args.field_1.values_ = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_90
  ;
  args.desc_ = (unsigned_long_long)local_88;
  vsystem_error(in_stack_ffffffffffffffcc,format_str,args);
  return in_RDI;
}

Assistant:

auto system_error(int error_code, format_string<T...> fmt, T&&... args)
    -> std::system_error {
  return vsystem_error(error_code, fmt, fmt::make_format_args(args...));
}